

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::is_valid_path(string *path)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  uVar1 = path->_M_string_length;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if ((path->_M_dataplus)._M_p[uVar5] != '/') break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  lVar9 = 0;
  do {
    uVar5 = uVar6;
    uVar1 = path->_M_string_length;
    if (uVar1 <= uVar5) break;
    uVar6 = uVar5;
    do {
      uVar7 = uVar6;
      if ((path->_M_dataplus)._M_p[uVar6] == '/') break;
      uVar6 = uVar6 + 1;
      uVar7 = uVar1;
    } while (uVar1 != uVar6);
    pcVar8 = (char *)(uVar7 - uVar5);
    if (pcVar8 == (char *)0x0) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                    ,0x7ca,"bool httplib::detail::is_valid_path(const std::string &)");
    }
    iVar4 = std::__cxx11::string::compare((ulong)path,uVar5,pcVar8);
    uVar6 = uVar7;
    if (iVar4 == 0) {
LAB_00146739:
      uVar2 = path->_M_string_length;
      bVar3 = true;
      if (uVar7 < uVar2) {
        do {
          uVar6 = uVar7;
          if ((path->_M_dataplus)._M_p[uVar7] != '/') break;
          uVar7 = uVar7 + 1;
          uVar6 = uVar2;
        } while (uVar2 != uVar7);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((ulong)path,uVar5,pcVar8);
      if (iVar4 != 0) {
        lVar9 = lVar9 + 1;
        goto LAB_00146739;
      }
      if (lVar9 != 0) {
        lVar9 = lVar9 + -1;
        goto LAB_00146739;
      }
      lVar9 = 0;
      bVar3 = false;
    }
  } while (bVar3);
  return uVar1 <= uVar5;
}

Assistant:

inline bool is_valid_path(const std::string &path) {
  size_t level = 0;
  size_t i = 0;

  // Skip slash
  while (i < path.size() && path[i] == '/') {
    i++;
  }

  while (i < path.size()) {
    // Read component
    auto beg = i;
    while (i < path.size() && path[i] != '/') {
      i++;
    }

    auto len = i - beg;
    assert(len > 0);

    if (!path.compare(beg, len, ".")) {
      ;
    } else if (!path.compare(beg, len, "..")) {
      if (level == 0) { return false; }
      level--;
    } else {
      level++;
    }

    // Skip slash
    while (i < path.size() && path[i] == '/') {
      i++;
    }
  }

  return true;
}